

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::StoreMatches(cmMakefile *this,RegularExpression *re)

{
  ulong uVar1;
  char *value;
  long lVar2;
  char local_5e [8];
  char nMatches [2];
  string *var;
  string **local_28;
  string *m;
  int i;
  char highest;
  RegularExpression *re_local;
  cmMakefile *this_local;
  
  m._7_1_ = '\0';
  _i = re;
  re_local = (RegularExpression *)this;
  for (m._0_4_ = 0; (int)m < 10; m._0_4_ = (int)m + 1) {
    cmsys::RegularExpression::match_abi_cxx11_((string *)&var,_i,(int)m);
    local_28 = &var;
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      lVar2 = (long)(int)m;
      value = (char *)std::__cxx11::string::c_str();
      AddDefinition(this,matchVariables_abi_cxx11_ + lVar2,value);
      MarkVariableAsUsed(this,matchVariables_abi_cxx11_ + lVar2);
      m._7_1_ = (char)(int)m + '0';
    }
    std::__cxx11::string::~string((string *)&var);
  }
  local_5e[0] = m._7_1_;
  local_5e[1] = 0;
  AddDefinition(this,&nMatchesVariable_abi_cxx11_,local_5e);
  MarkVariableAsUsed(this,&nMatchesVariable_abi_cxx11_);
  return;
}

Assistant:

void cmMakefile::StoreMatches(cmsys::RegularExpression& re)
{
  char highest = 0;
  for (int i=0; i<10; i++)
    {
    std::string const& m = re.match(i);
    if(!m.empty())
      {
      std::string const& var = matchVariables[i];
      this->AddDefinition(var, m.c_str());
      this->MarkVariableAsUsed(var);
      highest = static_cast<char>('0' + i);
      }
    }
  char nMatches[] = {highest, '\0'};
  this->AddDefinition(nMatchesVariable, nMatches);
  this->MarkVariableAsUsed(nMatchesVariable);
}